

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O0

size_t ZSTD_ldm_getTableSize(ldmParams_t params)

{
  size_t sVar1;
  byte bVar2;
  int in_stack_00000008;
  ZSTD_paramSwitch_e in_stack_0000000c;
  size_t local_48;
  byte local_34;
  size_t totalSize;
  size_t ldmBucketSize;
  size_t ldmBucketSizeLog;
  size_t ldmHSize;
  
  bVar2 = (byte)in_stack_0000000c;
  local_34 = bVar2;
  if (params.enableLdm < in_stack_0000000c) {
    local_34 = (byte)params.enableLdm;
  }
  local_48 = ZSTD_cwksp_alloc_size(1L << (bVar2 - local_34 & 0x3f));
  sVar1 = ZSTD_cwksp_alloc_size((1L << (bVar2 & 0x3f)) << 3);
  local_48 = local_48 + sVar1;
  if (in_stack_00000008 != 1) {
    local_48 = 0;
  }
  return local_48;
}

Assistant:

size_t ZSTD_ldm_getTableSize(ldmParams_t params)
{
    size_t const ldmHSize = ((size_t)1) << params.hashLog;
    size_t const ldmBucketSizeLog = MIN(params.bucketSizeLog, params.hashLog);
    size_t const ldmBucketSize = ((size_t)1) << (params.hashLog - ldmBucketSizeLog);
    size_t const totalSize = ZSTD_cwksp_alloc_size(ldmBucketSize)
                           + ZSTD_cwksp_alloc_size(ldmHSize * sizeof(ldmEntry_t));
    return params.enableLdm == ZSTD_ps_enable ? totalSize : 0;
}